

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

int __thiscall clunk::Node::QSearch<true>(Node *this,int alpha,int beta,int depth)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  HashEntry *this_00;
  Move *this_01;
  int iVar4;
  int iVar5;
  int local_38;
  
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xeff,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  uVar2 = -alpha;
  if (0 < alpha) {
    uVar2 = alpha;
  }
  if (32000 < uVar2) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf00,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  uVar2 = -beta;
  if (0 < beta) {
    uVar2 = beta;
  }
  if (32000 < uVar2) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf01,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  if (0 < depth) {
    __assert_fail("depth <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf02,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  _stats._56_8_ = _stats._56_8_ + 1;
  if (_seldepth < this->ply) {
    _seldepth = this->ply;
  }
  this->depthChange = 0;
  this->pvCount = 0;
  bVar1 = IsDraw(this);
  if (bVar1) {
switchD_001316f9_caseD_2:
    iVar4 = DAT_00179a64;
    this->standPat = DAT_00179a64;
    return iVar4;
  }
  local_38 = this->ply + -32000;
  if (alpha < local_38) {
    alpha = local_38;
  }
  iVar4 = 0x7d01 - this->ply;
  if (beta <= iVar4) {
    iVar4 = beta;
  }
  if (this->child == (Node *)0x0 || iVar4 <= alpha) {
    return alpha;
  }
  this_00 = TranspositionTable<clunk::HashEntry>::Get
                      ((TranspositionTable<clunk::HashEntry> *)_tt,this->positionKey);
  if (this_00->key != this->positionKey) goto LAB_0013171c;
  _tt._8_8_ = _tt._8_8_ + 1;
  switch(this_00->flags & 7) {
  case 1:
    goto switchD_001316f9_caseD_1;
  case 2:
    goto switchD_001316f9_caseD_2;
  case 3:
    iVar3 = HashEntry::Score(this_00,this->ply);
    if (iVar3 <= alpha) {
      return iVar3;
    }
    break;
  case 4:
    iVar4 = HashEntry::Score(this_00,this->ply);
    return iVar4;
  case 5:
    iVar3 = HashEntry::Score(this_00,this->ply);
    if (iVar4 <= iVar3) {
      return iVar3;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf2d,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
LAB_0013171c:
  if (this->pvCount != 0) {
    __assert_fail("!pvCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf33,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  if (this->checks == 0) {
    Evaluate(this);
    local_38 = this->standPat;
    if (iVar4 <= local_38) {
      return local_38;
    }
    if (alpha <= local_38) {
      alpha = local_38;
    }
  }
  GenerateMoves<true,true>(this,depth);
  if (this->moveCount < 1) {
    if (this->checks == 0) {
      local_38 = this->standPat;
    }
    else {
      HashEntry::SetCheckmate(this_00,this->positionKey);
      _tt._16_8_ = _tt._16_8_ + 1;
switchD_001316f9_caseD_1:
      local_38 = this->ply + -32000;
    }
  }
  else {
    while (this_01 = GetNextMove(this), this_01 != (Move *)0x0) {
      bVar1 = Move::IsValid(this_01);
      if (!bVar1) {
        __assert_fail("move->IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf50,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
      if (alpha < local_38) {
        __assert_fail("best <= alpha",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf51,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
      if (iVar4 <= alpha) {
        __assert_fail("alpha < beta",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf52,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
      _stats._96_8_ = _stats._96_8_ + 1;
      Exec<true>(this,this_01,this->child);
      iVar3 = QSearch<false>(this->child,-iVar4,-alpha,depth + -1);
      Undo<true>(this,this_01);
      if (_stop != 0) {
        return iVar4;
      }
      iVar5 = -iVar3;
      if (SBORROW4(local_38,iVar5) != local_38 + iVar3 < 0) {
        UpdatePV(this,this_01);
        if (iVar4 == iVar5 || SBORROW4(iVar4,iVar5) != iVar4 + iVar3 < 0) {
          return iVar5;
        }
        local_38 = iVar5;
        if (alpha == iVar5 || SBORROW4(alpha,iVar5) != alpha + iVar3 < 0) {
          alpha = iVar5;
        }
      }
      if (iVar4 <= alpha) {
        __assert_fail("alpha < beta",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf62,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
    }
    if (alpha < local_38) {
      __assert_fail("best <= alpha",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xf65,"int clunk::Node::QSearch(int, int, const int) [color = true]");
    }
    if (iVar4 <= alpha) {
      __assert_fail("alpha < beta",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xf66,"int clunk::Node::QSearch(int, int, const int) [color = true]");
    }
  }
  return local_38;
}

Assistant:

int QSearch(int alpha, int beta, const int depth) {
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth <= 0);

    _stats.qnodes++;
    if (ply > _seldepth) {
      _seldepth = ply;
    }

    pvCount = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // transposition table lookup
    int score;
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        if ((score = entry->Score(ply)) <= alpha) {
          return score;
        }
        break;
      case HashEntry::ExactScore:
        return entry->Score(ply);
      case HashEntry::LowerBound:
        if ((score = entry->Score(ply)) >= beta) {
          return score;
        }
        break;
      default:
        assert(false);
      }
    }

    assert(best <= alpha);
    assert(alpha < beta);
    assert(!pvCount);

    // if not in check allow standPat
    if (!checks) {
      Evaluate();
      if (standPat >= beta) {
        return standPat;
      }
      alpha = std::max<int>(alpha, standPat);
      best = standPat;
      assert(best <= alpha);
      assert(alpha < beta);
    }

    // generate moves
    GenerateMoves<color, true>(depth);
    if (moveCount <= 0) {
      if (checks) {
        entry->SetCheckmate(positionKey);
        _tt.IncCheckmates();
        return (ply - Infinity);
      }
      // don't call _tt.StoreStalemate()!!!
      return standPat;
    }

    // search 'em
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      assert(best <= alpha);
      assert(alpha < beta);
      _stats.qexecs++;
      Exec<color>(*move, *child);
      score = -child->QSearch<!color>(-beta, -alpha, (depth - 1));
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (score > best) {
        UpdatePV(*move);
        if (score >= beta) {
          return score;
        }
        alpha = std::max<int>(alpha, score);
        best = score;
      }
      assert(alpha < beta);
    }

    assert(best <= alpha);
    assert(alpha < beta);
    return best;
  }